

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O1

MPP_RET jpegd_prepare(void *ctx,MppPacket pkt,HalDecTask *task)

{
  MppPacket s;
  RK_U32 RVar1;
  uint uVar2;
  void *__src;
  size_t sVar3;
  RK_S64 RVar4;
  void *pvVar5;
  uint uVar6;
  char *fname;
  char *fmt;
  uint uVar7;
  long lVar8;
  ulong __size;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar9;
  
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_prepare");
  }
  if (*(int *)((long)ctx + 0x48) == 0) {
    *(MppPacket *)((long)ctx + 0x28) = pkt;
  }
  s = *(MppPacket *)((long)ctx + 0x28);
  __src = mpp_packet_get_pos(pkt);
  sVar3 = mpp_packet_get_length(pkt);
  uVar7 = (uint)sVar3;
  if (uVar7 == 0) {
    RVar1 = 1;
  }
  else {
    RVar1 = mpp_packet_get_eos(pkt);
  }
  RVar4 = mpp_packet_get_pts(pkt);
  *(RK_S64 *)((long)ctx + 0x38) = RVar4;
  task->valid = 0;
  (task->flags).val = (task->flags).val & 0xfffffffffffffffe | (ulong)(RVar1 & 1);
  *(RK_U32 *)((long)ctx + 0x40) = RVar1;
  if (((byte)jpegd_debug & 0x20) != 0) {
    _mpp_log_l(4,"jpegd_parser","pkt_length %d eos %d\n",(char *)0x0,sVar3 & 0xffffffff,(ulong)RVar1
              );
  }
  if (uVar7 == 0) {
    if (((byte)jpegd_debug & 0x20) == 0) {
      return MPP_OK;
    }
    fmt = "it is end of stream.";
    fname = (char *)0x0;
    goto LAB_001ba056;
  }
  if (*(uint *)((long)ctx + 0x24) < uVar7) {
    if (((byte)jpegd_debug & 0x20) != 0) {
      _mpp_log_l(4,"jpegd_parser","Huge Frame(%d Bytes)! bufferSize:%d",(char *)0x0);
    }
    mpp_osal_free("jpegd_prepare",*(void **)((long)ctx + 0x18));
    *(undefined8 *)((long)ctx + 0x18) = 0;
    pvVar5 = mpp_osal_calloc("jpegd_prepare",(ulong)(uVar7 + 0x400));
    *(void **)((long)ctx + 0x18) = pvVar5;
    if (pvVar5 == (void *)0x0) {
      _mpp_log_l(2,"jpegd_parser","no memory!","jpegd_prepare");
      return MPP_ERR_NOMEM;
    }
    *(uint *)((long)ctx + 0x24) = uVar7 + 0x400;
  }
  if (*(int *)((long)ctx + 0x48) == 0) {
    uVar6 = 0;
  }
  else {
    pvVar5 = *(void **)((long)ctx + 0x18);
    uVar6 = *(uint *)((long)ctx + 0x24);
    if (((byte)jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_split_frame");
    }
    if (__src == (void *)0x0 || pvVar5 == (void *)0x0) {
      uVar6 = 0;
      _mpp_log_l(2,"jpegd_parser","NULL pointer or wrong src_size(%d)","jpegd_split_frame",
                 sVar3 & 0xffffffff);
    }
    else {
      if ((((*(char *)((long)__src + 6) == 'A') && (*(char *)((long)__src + 7) == 'V')) &&
          (*(char *)((long)__src + 8) == 'I')) && (*(char *)((long)__src + 9) == '1')) {
        if (((byte)jpegd_debug & 0x20) != 0) {
          _mpp_log_l(4,"jpegd_parser","distinguish 310 from 210 camera",(char *)0x0);
        }
        if (uVar7 == 4) {
          uVar2 = 0;
          lVar8 = 0;
        }
        else {
          lVar8 = 0;
          uVar2 = 0;
          do {
            uVar6 = uVar2;
            if (((*(char *)((long)__src + (ulong)uVar2) == -1) &&
                (*(char *)((ulong)uVar2 + 1 + (long)__src) == '\0')) &&
               ((*(char *)((long)__src + (ulong)(uVar2 + 2)) == -1 &&
                (uVar6 = uVar2 + 2, (*(byte *)((long)__src + (ulong)(uVar2 + 3)) & 0xf0) != 0xd0))))
            {
              uVar6 = uVar2;
            }
            *(undefined1 *)((long)pvVar5 + lVar8) = *(undefined1 *)((long)__src + (ulong)uVar6);
            uVar2 = uVar6 + 1;
            lVar8 = lVar8 + 1;
          } while (uVar2 < uVar7 - 4);
          pvVar5 = (void *)((long)pvVar5 + lVar8);
        }
        uVar6 = (uint)lVar8;
        if (uVar2 <= uVar7 && uVar7 - uVar2 != 0) {
          lVar8 = 0;
          do {
            *(undefined1 *)((long)pvVar5 + lVar8) =
                 *(undefined1 *)((long)__src + lVar8 + (ulong)uVar2);
            lVar8 = lVar8 + 1;
          } while ((sVar3 & 0xffffffff) - (ulong)uVar2 != lVar8);
          uVar6 = (uVar7 - uVar2) + uVar6;
          pvVar5 = (void *)((long)pvVar5 + lVar8);
        }
        uVar2 = uVar7 - uVar6;
        if (uVar6 <= uVar7 && uVar2 != 0) goto LAB_001b9e7f;
      }
      else {
        uVar2 = uVar7 + 0xff & 0xffffff00;
        memcpy(pvVar5,__src,sVar3 & 0xffffffff);
        pvVar5 = (void *)((long)pvVar5 + (sVar3 & 0xffffffff));
        if (uVar6 <= uVar2) {
          uVar2 = uVar6;
        }
        uVar2 = uVar2 - uVar7;
        uVar6 = uVar7;
LAB_001b9e7f:
        memset(pvVar5,0,(ulong)uVar2);
      }
      if (((byte)jpegd_debug & 1) != 0) {
        _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_split_frame");
      }
    }
  }
  __size = sVar3 & 0xffffffff;
  mpp_packet_set_pos(pkt,(void *)((long)__src + __size));
  if ((uVar6 != uVar7) && (((byte)jpegd_debug & 0x20) != 0)) {
    _mpp_log_l(4,"jpegd_parser","packet prepare, pkt_length:%d, copy_length:%d\n",(char *)0x0,
               sVar3 & 0xffffffff,(ulong)uVar6);
  }
  if (((byte)jpegd_debug & 0x10) != 0) {
    snprintf(jpegd_prepare::name,0x1f,"/data/input%02d.jpg");
    jpegd_prepare::jpg_file = (FILE *)fopen(jpegd_prepare::name,"wb+");
    if ((FILE *)jpegd_prepare::jpg_file != (FILE *)0x0) {
      if (((byte)jpegd_debug & 0x10) != 0) {
        uVar9 = 0;
        _mpp_log_l(4,"jpegd_parser","frame_%02d input jpeg(%d Bytes) saving to %s\n",(char *)0x0,
                   (ulong)*(uint *)((long)ctx + 0x44),sVar3 & 0xffffffff,jpegd_prepare::name);
      }
      fwrite(__src,__size,1,(FILE *)jpegd_prepare::jpg_file);
      fclose((FILE *)jpegd_prepare::jpg_file);
      *(int *)((long)ctx + 0x44) = *(int *)((long)ctx + 0x44) + 1;
    }
  }
  if (*(int *)((long)ctx + 0x48) != 0) {
    mpp_packet_set_data(s,*(void **)((long)ctx + 0x18));
    mpp_packet_set_size(s,__size);
    mpp_packet_set_length(s,__size);
    memcpy(__src,*(void **)((long)ctx + 0x18),__size);
  }
  *(uint *)((long)ctx + 0x20) = uVar7;
  task->input_packet = s;
  task->valid = 1;
  if (((byte)jpegd_debug & 0x20) != 0) {
    _mpp_log_l(4,"jpegd_parser","input_packet:%p, recv_buffer:%p, pkt_length:%d",(char *)0x0,s,
               *(undefined8 *)((long)ctx + 0x18),CONCAT44(uVar9,uVar7));
  }
  if (((byte)jpegd_debug & 1) == 0) {
    return MPP_OK;
  }
  fmt = "exit\n";
  fname = "jpegd_prepare";
LAB_001ba056:
  _mpp_log_l(4,"jpegd_parser",fmt,fname);
  return MPP_OK;
}

Assistant:

static MPP_RET jpegd_prepare(void *ctx, MppPacket pkt, HalDecTask *task)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;
    JpegdCtx *JpegCtx = (JpegdCtx *)ctx;
    if (!JpegCtx->copy_flag) {
        /* no need to copy stream, handle packet from upper application directly*/
        JpegCtx->input_packet = pkt;
    }

    MppPacket input_packet = JpegCtx->input_packet;
    RK_U32 copy_length = 0;
    void *base = mpp_packet_get_pos(pkt);
    RK_U8 *pos = base;
    RK_U32 pkt_length = (RK_U32)mpp_packet_get_length(pkt);
    RK_U32 eos = (pkt_length) ? (mpp_packet_get_eos(pkt)) : (1);

    JpegCtx->pts = mpp_packet_get_pts(pkt);

    task->valid = 0;
    task->flags.eos = eos;
    JpegCtx->eos = eos;

    jpegd_dbg_parser("pkt_length %d eos %d\n", pkt_length, eos);

    if (!pkt_length) {
        jpegd_dbg_parser("it is end of stream.");
        return ret;
    }

    if (pkt_length > JpegCtx->bufferSize) {
        jpegd_dbg_parser("Huge Frame(%d Bytes)! bufferSize:%d",
                         pkt_length, JpegCtx->bufferSize);
        mpp_free(JpegCtx->recv_buffer);
        JpegCtx->recv_buffer = NULL;

        JpegCtx->recv_buffer = mpp_calloc(RK_U8, pkt_length + 1024);
        if (NULL == JpegCtx->recv_buffer) {
            mpp_err_f("no memory!");
            return MPP_ERR_NOMEM;
        }

        JpegCtx->bufferSize = pkt_length + 1024;
    }

    if (JpegCtx->copy_flag)
        jpegd_split_frame(base, pkt_length, JpegCtx->recv_buffer,
                          JpegCtx->bufferSize, &copy_length);

    pos += pkt_length;
    mpp_packet_set_pos(pkt, pos);
    if (copy_length != pkt_length) {
        jpegd_dbg_parser("packet prepare, pkt_length:%d, copy_length:%d\n",
                         pkt_length, copy_length);
    }

    /* debug information */
    if (jpegd_debug & JPEGD_DBG_IO) {
        static FILE *jpg_file;
        static char name[32];

        snprintf(name, sizeof(name) - 1, "/data/input%02d.jpg",
                 JpegCtx->input_jpeg_count);
        jpg_file = fopen(name, "wb+");
        if (jpg_file) {
            jpegd_dbg_io("frame_%02d input jpeg(%d Bytes) saving to %s\n",
                         JpegCtx->input_jpeg_count, pkt_length, name);
            fwrite(base, pkt_length, 1, jpg_file);
            fclose(jpg_file);
            JpegCtx->input_jpeg_count++;
        }
    }

    if (JpegCtx->copy_flag) {
        mpp_packet_set_data(input_packet, JpegCtx->recv_buffer);
        mpp_packet_set_size(input_packet, pkt_length);
        mpp_packet_set_length(input_packet, pkt_length);
        memcpy(base, JpegCtx->recv_buffer, pkt_length);
    }

    JpegCtx->streamLength = pkt_length;
    task->input_packet = input_packet;
    task->valid = 1;
    jpegd_dbg_parser("input_packet:%p, recv_buffer:%p, pkt_length:%d",
                     input_packet,
                     JpegCtx->recv_buffer, pkt_length);

    jpegd_dbg_func("exit\n");
    return ret;
}